

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_resumption_impl(int different_preferred_key_share,int require_client_authentication)

{
  uint16_t uVar1;
  ptls_key_exchange_algorithm_t **pppVar2;
  bool bVar3;
  ptls_context_t *ppVar4;
  ptls_context_t *ppVar5;
  ulong uVar6;
  size_t sVar7;
  bool bVar8;
  ptls_save_ticket_t st;
  ptls_encrypt_ticket_t et;
  ptls_key_exchange_algorithm_t *different_key_exchanges [3];
  ptls_save_ticket_t local_58;
  ptls_encrypt_ticket_t local_50;
  ptls_key_exchange_algorithm_t *local_48;
  ptls_key_exchange_algorithm_t *local_40;
  undefined8 local_38;
  
  ppVar5 = ctx;
  ppVar4 = ctx_peer;
  uVar1 = (*ctx->key_exchanges)->id;
  if (uVar1 != (*ctx_peer->key_exchanges)->id) {
    __assert_fail("ctx->key_exchanges[0]->id == ctx_peer->key_exchanges[0]->id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0x38d,"void test_resumption_impl(int, int)");
  }
  if (ctx->key_exchanges[1] != (ptls_key_exchange_algorithm_t *)0x0) {
    __assert_fail("ctx->key_exchanges[1] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0x38e,"void test_resumption_impl(int, int)");
  }
  if (ctx_peer->key_exchanges[1] != (ptls_key_exchange_algorithm_t *)0x0) {
    __assert_fail("ctx_peer->key_exchanges[1] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0x38f,"void test_resumption_impl(int, int)");
  }
  if (uVar1 != 0x1d) {
    local_48 = &ptls_minicrypto_x25519;
    local_40 = *ctx->key_exchanges;
    local_38 = 0;
    pppVar2 = ctx->key_exchanges;
    if (different_preferred_key_share != 0) {
      ctx->key_exchanges = &local_48;
    }
    local_50.cb = on_copy_ticket;
    local_58.cb = on_save_ticket;
    if (ppVar4->ticket_lifetime != 0) {
      __assert_fail("ctx_peer->ticket_lifetime == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                    ,0x39a,"void test_resumption_impl(int, int)");
    }
    if (ppVar4->max_early_data_size != 0) {
      __assert_fail("ctx_peer->max_early_data_size == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                    ,0x39b,"void test_resumption_impl(int, int)");
    }
    if (ppVar4->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
      if (ppVar4->save_ticket == (ptls_save_ticket_t *)0x0) {
        saved_ticket = (ptls_iovec_t)ZEXT816(0);
        ppVar4->ticket_lifetime = 0x15180;
        ppVar4->max_early_data_size = 0x2000;
        ppVar4->encrypt_ticket = &local_50;
        ppVar5->save_ticket = &local_58;
        sc_callcnt = 0;
        test_handshake((ptls_iovec_t)ZEXT816(0),(uint)(different_preferred_key_share != 0),1,0,0);
        _ok((uint)(sc_callcnt == 1),"%s %d",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
            0x3a7);
        _ok((uint)(saved_ticket.base != (uint8_t *)0x0),"%s %d",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
            0x3a8);
        test_handshake(saved_ticket,0,1,0,require_client_authentication);
        bVar8 = require_client_authentication == 1;
        bVar3 = !bVar8;
        uVar6 = (ulong)bVar8;
        sVar7 = 1;
        if (bVar8) {
          sVar7 = 7;
        }
        _ok((uint)(sc_callcnt == uVar6 * 2 + 1),"%s %d",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
            (ulong)(bVar3 + 0x3ad + (uint)bVar3));
        test_handshake(saved_ticket,4,1,0,require_client_authentication);
        _ok((uint)(sc_callcnt == uVar6 * 4 + 1),"%s %d",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
            (ulong)((uint)bVar3 * 2 + 0x3b5));
        ctx->field_0x70 = ctx->field_0x70 | 1;
        test_handshake(saved_ticket,0,1,0,require_client_authentication);
        _ok((uint)(sc_callcnt == sVar7),"%s %d",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
            (ulong)((uint)bVar3 * 2 + 0x3bf));
        test_handshake(saved_ticket,4,1,0,require_client_authentication);
        _ok((uint)(sc_callcnt == uVar6 * 8 + 1),"%s %d",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
            (ulong)((uint)bVar3 * 2 + 0x3c7));
        ppVar5 = ctx;
        ctx->field_0x70 = ctx->field_0x70 & 0xfe;
        ppVar4 = ctx_peer;
        ppVar4->ticket_lifetime = 0;
        ppVar4->max_early_data_size = 0;
        ppVar4->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
        ppVar5->save_ticket = (ptls_save_ticket_t *)0x0;
        ppVar5->key_exchanges = pppVar2;
        return;
      }
      __assert_fail("ctx_peer->save_ticket == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                    ,0x39d,"void test_resumption_impl(int, int)");
    }
    __assert_fail("ctx_peer->encrypt_ticket == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0x39c,"void test_resumption_impl(int, int)");
  }
  __assert_fail("ctx->key_exchanges[0]->id != ptls_minicrypto_x25519.id",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                ,0x390,"void test_resumption_impl(int, int)");
}

Assistant:

static void test_resumption_impl(int different_preferred_key_share, int require_client_authentication)
{
    assert(ctx->key_exchanges[0]->id == ctx_peer->key_exchanges[0]->id);
    assert(ctx->key_exchanges[1] == NULL);
    assert(ctx_peer->key_exchanges[1] == NULL);
    assert(ctx->key_exchanges[0]->id != ptls_minicrypto_x25519.id);
    ptls_key_exchange_algorithm_t *different_key_exchanges[] = {&ptls_minicrypto_x25519, ctx->key_exchanges[0], NULL},
                                  **key_exchanges_orig = ctx->key_exchanges;

    if (different_preferred_key_share)
        ctx->key_exchanges = different_key_exchanges;

    ptls_encrypt_ticket_t et = {on_copy_ticket};
    ptls_save_ticket_t st = {on_save_ticket};

    assert(ctx_peer->ticket_lifetime == 0);
    assert(ctx_peer->max_early_data_size == 0);
    assert(ctx_peer->encrypt_ticket == NULL);
    assert(ctx_peer->save_ticket == NULL);
    saved_ticket = ptls_iovec_init(NULL, 0);

    ctx_peer->ticket_lifetime = 86400;
    ctx_peer->max_early_data_size = 8192;
    ctx_peer->encrypt_ticket = &et;
    ctx->save_ticket = &st;

    sc_callcnt = 0;
    test_handshake(saved_ticket, different_preferred_key_share ? TEST_HANDSHAKE_2RTT : TEST_HANDSHAKE_1RTT, 1, 0, 0);
    ok(sc_callcnt == 1);
    ok(saved_ticket.base != NULL);

    /* psk using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_1RTT, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 3);
    } else {
        ok(sc_callcnt == 1);
    }

    /* 0-rtt psk using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_EARLY_DATA, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 5);
    } else {
        ok(sc_callcnt == 1);
    }

    ctx->require_dhe_on_psk = 1;

    /* psk-dhe using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_1RTT, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 7);
    } else {
        ok(sc_callcnt == 1);
    }

    /* 0-rtt psk-dhe using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_EARLY_DATA, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 9);
    } else {
        ok(sc_callcnt == 1);
    }

    ctx->require_dhe_on_psk = 0;
    ctx_peer->ticket_lifetime = 0;
    ctx_peer->max_early_data_size = 0;
    ctx_peer->encrypt_ticket = NULL;
    ctx->save_ticket = NULL;
    ctx->key_exchanges = key_exchanges_orig;
}